

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_parser<char,_std::allocator<char>_>::end_value_with_numeric_check
          (basic_csv_parser<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor,
          error_code *ec)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  difference_type dVar4;
  reference pcVar5;
  double value;
  basic_json_visitor<char> *this_00;
  ser_context *in_RSI;
  long in_RDI;
  type tVar6;
  type tVar7;
  double d;
  type result_1;
  uint64_t val_1;
  type result;
  int64_t val;
  iterator p;
  string buffer;
  iterator last;
  bool is_negative;
  numeric_check_state state;
  error_code *in_stack_fffffffffffffe38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe40;
  semantic_tag sVar8;
  string_view_type *in_stack_fffffffffffffe48;
  error_code *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  long *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  size_t in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  chars_to *in_stack_fffffffffffffea0;
  bool local_109;
  char *local_b0;
  to_integer_errc local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  char *local_88;
  to_integer_errc local_80;
  char *local_78;
  to_integer_errc local_70;
  undefined8 local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48 [32];
  undefined8 local_28;
  byte local_1d;
  int local_1c;
  ser_context *local_10;
  
  local_1c = 0;
  local_1d = 0;
  local_10 = in_RSI;
  local_28 = std::__cxx11::string::end();
  std::__cxx11::string::string(local_48);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_109 = false;
    if (local_1c != 0xb) {
      local_109 = __gnu_cxx::operator!=
                            (in_stack_fffffffffffffe40,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffe38);
    }
    if (local_109 == false) break;
    switch(local_1c) {
    case 0:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      switch(*pcVar5) {
      case '-':
        local_1d = 1;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 4;
        break;
      default:
        local_1c = 0xb;
        break;
      case '0':
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 5;
        break;
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 6;
        break;
      case 'F':
      case 'f':
        dVar4 = __gnu_cxx::operator-
                          (in_stack_fffffffffffffe40,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe38);
        if ((((dVar4 == 5) &&
             ((pcVar5 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator[](&local_50,1), *pcVar5 == 'a' ||
              (pcVar5 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator[](&local_50,1), *pcVar5 == 'A')))) &&
            ((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,2), *pcVar5 == 'l' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,2), *pcVar5 == 'L')))) &&
           (((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,3), *pcVar5 == 's' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,3), *pcVar5 == 'S')) &&
            ((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,4), *pcVar5 == 'e' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,4), *pcVar5 == 'E')))))) {
          local_1c = 3;
        }
        else {
          local_1c = 0xb;
        }
        break;
      case 'N':
      case 'n':
        dVar4 = __gnu_cxx::operator-
                          (in_stack_fffffffffffffe40,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe38);
        if (((dVar4 == 4) &&
            ((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,1), *pcVar5 == 'u' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,1), *pcVar5 == 'U')))) &&
           (((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,2), *pcVar5 == 'l' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,2), *pcVar5 == 'L')) &&
            ((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,3), *pcVar5 == 'l' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,3), *pcVar5 == 'L')))))) {
          local_1c = 1;
        }
        else {
          local_1c = 0xb;
        }
        break;
      case 'T':
      case 't':
        dVar4 = __gnu_cxx::operator-
                          (in_stack_fffffffffffffe40,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffe38);
        if ((((dVar4 == 4) &&
             ((pcVar5 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator[](&local_50,1), *pcVar5 == 'r' ||
              (pcVar5 = __gnu_cxx::
                        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator[](&local_50,1), *pcVar5 == 'R')))) &&
            ((pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,2), *pcVar5 == 'u' ||
             (pcVar5 = __gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator[](&local_50,2), *pcVar5 == 'U')))) &&
           ((pcVar5 = __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](&local_50,3), *pcVar5 == 'e' ||
            (pcVar5 = __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](&local_50,3), *pcVar5 == 'U')))) {
          local_1c = 2;
        }
        else {
          local_1c = 0xb;
        }
      }
      break;
    default:
      break;
    case 4:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      if (*pcVar5 == 0x30) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 5;
      }
      else if ((int)*pcVar5 - 0x31U < 9) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 6;
      }
      else {
        local_1c = 0xb;
      }
      break;
    case 5:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      cVar1 = *pcVar5;
      if (cVar1 == '.') {
        jsoncons::detail::chars_to::get_decimal_point((chars_to *)(in_RDI + 0x90));
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 7;
      }
      else if ((cVar1 == 'E') || (cVar1 == 'e')) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 9;
      }
      else {
        local_1c = 0xb;
      }
      break;
    case 6:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      switch(*pcVar5) {
      case '.':
        jsoncons::detail::chars_to::get_decimal_point((chars_to *)(in_RDI + 0x90));
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 7;
        break;
      default:
        local_1c = 0xb;
        break;
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        break;
      case 'E':
      case 'e':
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 9;
      }
      break;
    case 7:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      if ((int)*pcVar5 - 0x30U < 10) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 8;
      }
      else {
        local_1c = 0xb;
      }
      break;
    case 8:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      iVar3 = (int)*pcVar5;
      if (iVar3 - 0x30U < 10) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
      }
      else if ((iVar3 == 0x45) || (iVar3 == 0x65)) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
        local_1c = 9;
      }
      else {
        local_1c = 0xb;
      }
      break;
    case 9:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      iVar3 = (int)*pcVar5;
      if (iVar3 != 0x2b) {
        if (iVar3 == 0x2d) {
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_50);
          std::__cxx11::string::push_back((char)local_48);
        }
        else if (iVar3 - 0x30U < 10) {
          local_1c = 10;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_50);
          std::__cxx11::string::push_back((char)local_48);
        }
        else {
          local_1c = 0xb;
        }
      }
      break;
    case 10:
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      if ((int)*pcVar5 - 0x30U < 10) {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_50);
        std::__cxx11::string::push_back((char)local_48);
      }
      else {
        local_1c = 0xb;
      }
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_50);
  }
  sVar8 = (semantic_tag)((ulong)in_stack_fffffffffffffe48 >> 0x30);
  bVar2 = SUB81((ulong)in_stack_fffffffffffffe48 >> 0x38,0);
  switch(local_1c) {
  case 1:
    basic_json_visitor<char>::null_value
              ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,bVar2,
               (ser_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    break;
  case 2:
    basic_json_visitor<char>::bool_value
              ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,bVar2,sVar8,
               (ser_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    break;
  case 3:
    basic_json_visitor<char>::bool_value
              ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,bVar2,sVar8,
               (ser_context *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    break;
  default:
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x1c8));
    basic_json_visitor<char>::string_value
              ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (semantic_tag)((ulong)in_stack_fffffffffffffe40 >> 0x38),local_10,
               (error_code *)0x3f8b0c);
    *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    break;
  case 5:
  case 6:
    if ((local_1d & 1) == 0) {
      local_a0 = 0;
      std::__cxx11::string::data();
      sVar8 = (semantic_tag)((ulong)in_stack_fffffffffffffe40 >> 0x38);
      std::__cxx11::string::length();
      tVar7 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                         (unsigned_long *)in_stack_fffffffffffffe50);
      local_b0 = tVar7.ptr;
      local_a8 = tVar7.ec;
      bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&local_b0);
      if (bVar2) {
        basic_json_visitor<char>::uint64_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,
                   (uint64_t)in_stack_fffffffffffffe48,sVar8,
                   (ser_context *)in_stack_fffffffffffffe38,(error_code *)0x3f88af);
        *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
      }
      else if (local_a8 == overflow) {
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x1c8));
        basic_json_visitor<char>::string_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   sVar8,(ser_context *)in_stack_fffffffffffffe38,(error_code *)0x3f8932);
        *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
      }
      else {
        std::error_code::operator=
                  (in_stack_fffffffffffffe50,
                   (to_integer_errc)((ulong)in_stack_fffffffffffffe48 >> 0x38));
        *(undefined1 *)(in_RDI + 200) = 0;
      }
    }
    else {
      local_68 = 0;
      std::__cxx11::string::data();
      sVar8 = (semantic_tag)((ulong)in_stack_fffffffffffffe40 >> 0x38);
      std::__cxx11::string::length();
      tVar6 = jsoncons::detail::dec_to_integer<long,char>
                        ((char *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                         in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      local_88 = tVar6.ptr;
      local_80 = tVar6.ec;
      local_78 = local_88;
      local_70 = local_80;
      bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&local_78);
      if (bVar2) {
        basic_json_visitor<char>::int64_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,
                   (int64_t)in_stack_fffffffffffffe48,sVar8,(ser_context *)in_stack_fffffffffffffe38
                   ,(error_code *)0x3f8754);
        *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
      }
      else {
        local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)(in_RDI + 0x1c8));
        basic_json_visitor<char>::string_value
                  ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   sVar8,(ser_context *)in_stack_fffffffffffffe38,(error_code *)0x3f87ca);
        *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
      }
    }
    break;
  case 8:
  case 10:
    if ((*(byte *)(in_RDI + 0x53) & 1) == 0) {
      value = (double)(in_RDI + 0x90);
      sVar8 = (semantic_tag)((ulong)local_48 >> 0x38);
      this_00 = (basic_json_visitor<char> *)std::__cxx11::string::c_str();
      std::__cxx11::string::length();
      jsoncons::detail::chars_to::operator()
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      basic_json_visitor<char>::double_value
                (this_00,value,sVar8,(ser_context *)in_stack_fffffffffffffe38,(error_code *)0x3f8a9b
                );
      *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    }
    else {
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x1c8));
      basic_json_visitor<char>::string_value
                ((basic_json_visitor<char> *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                 (semantic_tag)((ulong)in_stack_fffffffffffffe40 >> 0x38),
                 (ser_context *)in_stack_fffffffffffffe38,(error_code *)0x3f89f5);
      *(byte *)(in_RDI + 200) = (*(byte *)(in_RDI + 0xd8) ^ 0xff) & 1;
    }
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void end_value_with_numeric_check(basic_json_visitor<CharT>& visitor, 
        std::error_code& ec)
    {
        numeric_check_state state = numeric_check_state::initial;
        bool is_negative = false;
        //int precision = 0;
        //uint8_t decimal_places = 0;

        auto last = buffer_.end();

        std::string buffer;
        for (auto p = buffer_.begin(); state != numeric_check_state::not_a_number && p != last; ++p)
        {
            switch (state)
            {
                case numeric_check_state::initial:
                {
                    switch (*p)
                    {
                    case 'n':case 'N':
                        if ((last-p) == 4 && (p[1] == 'u' || p[1] == 'U') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 'l' || p[3] == 'L'))
                        {
                            state = numeric_check_state::null;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 't':case 'T':
                        if ((last-p) == 4 && (p[1] == 'r' || p[1] == 'R') && (p[2] == 'u' || p[2] == 'U') && (p[3] == 'e' || p[3] == 'U'))
                        {
                            state = numeric_check_state::boolean_true;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case 'f':case 'F':
                        if ((last-p) == 5 && (p[1] == 'a' || p[1] == 'A') && (p[2] == 'l' || p[2] == 'L') && (p[3] == 's' || p[3] == 'S') && (p[4] == 'e' || p[4] == 'E'))
                        {
                            state = numeric_check_state::boolean_false;
                        }
                        else
                        {
                            state = numeric_check_state::not_a_number;
                        }
                        break;
                    case '-':
                        is_negative = true;
                        buffer.push_back(*p);
                        state = numeric_check_state::minus;
                        break;
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::zero:
                {
                    switch (*p)
                    {
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::integer:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        break;
                    case '.':
                        buffer.push_back(to_double_.get_decimal_point());
                        state = numeric_check_state::fraction1;
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::minus:
                {
                    switch (*p)
                    {
                    case '0':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::zero;
                        break;
                    case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        buffer.push_back(*p);
                        state = numeric_check_state::integer;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction1:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        state = numeric_check_state::fraction;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::fraction:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        //++precision;
                        //++decimal_places;
                        buffer.push_back(*p);
                        break;
                    case 'e':case 'E':
                        buffer.push_back(*p);
                        state = numeric_check_state::exp1;
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp1:
                {
                    switch (*p)
                    {
                    case '-':
                        buffer.push_back(*p);
                        break;
                    case '+':
                        break;
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        state = numeric_check_state::exp;
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                case numeric_check_state::exp:
                {
                    switch (*p)
                    {
                    case '0':case '1':case '2':case '3':case '4':case '5':case '6':case '7':case '8':case '9':
                        buffer.push_back(*p);
                        break;
                    default:
                        state = numeric_check_state::not_a_number;
                        break;
                    }
                    break;
                }
                default:
                    break;
            }
        }

        switch (state)
        {
            case numeric_check_state::null:
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_true:
                visitor.bool_value(true, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::boolean_false:
                visitor.bool_value(false, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            case numeric_check_state::zero:
            case numeric_check_state::integer:
            {
                if (is_negative)
                {
                    int64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.int64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else // Must be overflow
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                }
                else
                {
                    uint64_t val{ 0 };
                    auto result = jsoncons::detail::dec_to_integer(buffer_.data(), buffer_.length(), val);
                    if (result)
                    {
                        visitor.uint64_value(val, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else if (result.ec == jsoncons::detail::to_integer_errc::overflow)
                    {
                        visitor.string_value(buffer_, semantic_tag::bigint, *this, ec);
                        more_ = !cursor_mode_;
                    }
                    else
                    {
                        ec = result.ec;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case numeric_check_state::fraction:
            case numeric_check_state::exp:
            {
                if (lossless_number_)
                {
                    visitor.string_value(buffer_,semantic_tag::bigdec, *this, ec);
                    more_ = !cursor_mode_;
                }
                else
                {
                    double d = to_double_(buffer.c_str(), buffer.length());
                    visitor.double_value(d, semantic_tag::none, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            default:
            {
                visitor.string_value(buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
        }
    }